

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  uint uVar1;
  uint uVar2;
  ImGuiWindow **ppIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  uint uVar6;
  
  pIVar4 = GImGui;
  uVar2 = (GImGui->Windows).Size;
  if ((long)(int)uVar2 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5cc,"T &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
  }
  ppIVar3 = (GImGui->Windows).Data;
  if (((ppIVar3[(long)(int)uVar2 + -1] != window) &&
      (ppIVar3[(long)(int)uVar2 + -1]->RootWindow != window)) && (uVar2 != 1)) {
    lVar5 = 0;
    uVar6 = uVar2 - 1;
    do {
      uVar1 = uVar6 - 1;
      if (ppIVar3[uVar1] == window) {
        if (uVar6 < uVar2) {
          memmove(ppIVar3 + uVar1,ppIVar3 + (ulong)(uVar2 - 1) + lVar5,(long)(1 - (int)lVar5) << 3);
          lVar5 = (long)(pIVar4->Windows).Size;
          if (0 < lVar5) {
            (pIVar4->Windows).Data[lVar5 + -1] = window;
            return;
          }
        }
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      lVar5 = lVar5 + -1;
      uVar6 = uVar1;
    } while (0 < (int)uVar1);
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window) // Cheap early out (could be better)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}